

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O0

int buffer_pwrite(int n,char *s,uint len)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  DIR *__dirp;
  dirent *pdVar5;
  int local_5c;
  char local_58 [4];
  int j;
  char oldest [30];
  dirent *f;
  DIR *d;
  int i;
  uint len_local;
  char *s_local;
  int n_local;
  
  d._4_4_ = len;
  if (dir[n].sizemax != 0) {
    if (dir[n].sizemax <= dir[n].size) {
      rotate(dir + n);
    }
    if (dir[n].sizemax - dir[n].size < (ulong)len) {
      d._4_4_ = (int)dir[n].sizemax - (int)dir[n].size;
    }
  }
  while( true ) {
    sVar3 = write(dir[n].fdcur,s,(ulong)d._4_4_);
    iVar1 = (int)sVar3;
    if (iVar1 != -1) break;
    piVar4 = __errno_location();
    if ((*piVar4 == 0x1c) && (dir[n].nmin < dir[n].nmax)) {
      local_5c = 0;
      while (iVar1 = fchdir(dir[n].fddir), iVar1 == -1) {
        pause2("unable to change directory, want remove old logfile",dir[n].name);
      }
      local_58[0] = 'A';
      oldest[0x13] = '\0';
      local_58[1] = 0;
      while (__dirp = opendir("."), __dirp == (DIR *)0x0) {
        pause2("unable to open directory, want remove old logfile",dir[n].name);
      }
      piVar4 = __errno_location();
      *piVar4 = 0;
      while (pdVar5 = readdir(__dirp), pdVar5 != (dirent *)0x0) {
        if ((pdVar5->d_name[0] == '@') && (uVar2 = str_len(pdVar5->d_name), uVar2 == 0x1b)) {
          local_5c = local_5c + 1;
          iVar1 = str_diff(pdVar5->d_name,local_58);
          if (iVar1 < 0) {
            byte_copy(local_58,0x1b,pdVar5->d_name);
          }
        }
      }
      piVar4 = __errno_location();
      if (*piVar4 != 0) {
        warn2("unable to read directory, want remove old logfile",dir[n].name);
      }
      closedir(__dirp);
      piVar4 = __errno_location();
      *piVar4 = 0x1c;
      if ((dir[n].nmin < (ulong)(long)local_5c) && (local_58[0] == '@')) {
        strerr_warn("svlogd: warning: ","out of disk space, delete: ",dir[n].name,"/",local_58,
                    (char *)0x0,(strerr *)0x0);
        piVar4 = __errno_location();
        *piVar4 = 0;
        iVar1 = unlink(local_58);
        if (iVar1 == -1) {
          warn2("unable to unlink oldest logfile",dir[n].name);
          piVar4 = __errno_location();
          *piVar4 = 0x1c;
        }
        while (iVar1 = fchdir(fdwdir), iVar1 == -1) {
          pause1("unable to change to initial working directory");
        }
      }
    }
    piVar4 = __errno_location();
    if (*piVar4 != 0) {
      pause2("unable to write to current",dir[n].name);
    }
  }
  dir[n].size = (long)iVar1 + dir[n].size;
  if (((dir[n].sizemax != 0) && (s[iVar1 + -1] == '\n')) &&
     (dir[n].sizemax - linemax <= dir[n].size)) {
    rotate(dir + n);
  }
  return iVar1;
}

Assistant:

int buffer_pwrite(int n, char *s, unsigned int len) {
  int i;

  if ((dir +n)->sizemax) {
    if ((dir +n)->size >= (dir +n)->sizemax) rotate(dir +n);
    if (len > ((dir +n)->sizemax -(dir +n)->size))
      len =(dir +n)->sizemax -(dir +n)->size;
  }
  while ((i =write((dir +n)->fdcur, s, len)) == -1) {
    if ((errno == ENOSPC) && ((dir +n)->nmin < (dir +n)->nmax)) {
      DIR *d;
      direntry *f;
      char oldest[FMT_PTIME];
      int j =0;

      while (fchdir((dir +n)->fddir) == -1)
        pause2("unable to change directory, want remove old logfile",
               (dir +n)->name);
      oldest[0] ='A'; oldest[1] =oldest[27] =0;
      while (! (d =opendir(".")))
        pause2("unable to open directory, want remove old logfile",
               (dir +n)->name);
      errno =0;
      while ((f =readdir(d)))
        if ((f->d_name[0] == '@') && (str_len(f->d_name) == 27)) {
          ++j;
          if (str_diff(f->d_name, oldest) < 0)
            byte_copy(oldest, 27, f->d_name);
        }
      if (errno) warn2("unable to read directory, want remove old logfile",
                       (dir +n)->name);
      closedir(d);
      errno =ENOSPC;
      if (j > (dir +n)->nmin)
        if (*oldest == '@') {
          strerr_warn5(WARNING, "out of disk space, delete: ", (dir +n)->name,
                       "/", oldest, 0);
          errno =0;
          if (unlink(oldest) == -1) {
            warn2("unable to unlink oldest logfile", (dir +n)->name);
            errno =ENOSPC;
          }
          while (fchdir(fdwdir) == -1)
            pause1("unable to change to initial working directory");
        }
    }
    if (errno) pause2("unable to write to current", (dir +n)->name);
  }

  (dir +n)->size +=i;
  if ((dir +n)->sizemax)
    if (s[i -1] == '\n')
      if ((dir +n)->size >= ((dir +n)->sizemax -linemax)) rotate(dir +n);
  return(i);
}